

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# internal_huf.c
# Opt level: O0

void hufBuildEncTable(uint64_t *frq,uint32_t *im,uint32_t *iM,uint32_t *hlink,uint64_t **fHeap,
                     uint64_t *scode)

{
  uint64_t **last;
  uint uVar1;
  long in_RCX;
  uint *in_RDX;
  uint *in_RSI;
  void *in_RDI;
  long *in_R8;
  uint64_t **in_R9;
  uint32_t j_1;
  uint32_t j;
  uint32_t m;
  uint32_t mm;
  uint32_t i;
  uint32_t nf;
  uint64_t *in_stack_00000140;
  uint in_stack_ffffffffffffffb8;
  uint in_stack_ffffffffffffffbc;
  uint in_stack_ffffffffffffffc0;
  uint uVar2;
  
  uVar2 = 0;
  *in_RSI = 0;
  while (*(long *)((long)in_RDI + (ulong)*in_RSI * 8) == 0) {
    *in_RSI = *in_RSI + 1;
  }
  for (uVar1 = *in_RSI; uVar1 < 0x10001; uVar1 = uVar1 + 1) {
    *(uint *)(in_RCX + (ulong)uVar1 * 4) = uVar1;
    if (*(long *)((long)in_RDI + (ulong)uVar1 * 8) != 0) {
      in_R8[uVar2] = (long)((long)in_RDI + (ulong)uVar1 * 8);
      uVar2 = uVar2 + 1;
      *in_RDX = uVar1;
    }
  }
  *in_RDX = *in_RDX + 1;
  *(undefined8 *)((long)in_RDI + (ulong)*in_RDX * 8) = 1;
  in_R8[uVar2] = (long)((long)in_RDI + (ulong)*in_RDX * 8);
  uVar2 = uVar2 + 1;
  make_heap(in_R9,CONCAT44(uVar2,uVar1));
  memset(in_R9,0,0x80008);
  while (1 < uVar2) {
    uVar1 = (uint)(*in_R8 - (long)in_RDI >> 3);
    pop_heap((uint64_t **)CONCAT44(uVar1,in_stack_ffffffffffffffc0),
             (uint64_t **)CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8));
    uVar2 = uVar2 - 1;
    in_stack_ffffffffffffffc0 = (uint)(*in_R8 - (long)in_RDI >> 3);
    pop_heap((uint64_t **)CONCAT44(uVar1,in_stack_ffffffffffffffc0),
             (uint64_t **)CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8));
    *(long *)((long)in_RDI + (ulong)in_stack_ffffffffffffffc0 * 8) =
         *(long *)((long)in_RDI + (ulong)uVar1 * 8) +
         *(long *)((long)in_RDI + (ulong)in_stack_ffffffffffffffc0 * 8);
    last = (uint64_t **)CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8);
    in_stack_ffffffffffffffb8 = uVar1;
    push_heap((uint64_t **)CONCAT44(uVar1,in_stack_ffffffffffffffc0),last);
    for (in_stack_ffffffffffffffbc = in_stack_ffffffffffffffc0;
        in_R9[in_stack_ffffffffffffffbc] = (uint64_t *)((long)in_R9[in_stack_ffffffffffffffbc] + 1),
        *(uint *)(in_RCX + (ulong)in_stack_ffffffffffffffbc * 4) != in_stack_ffffffffffffffbc;
        in_stack_ffffffffffffffbc = *(uint *)(in_RCX + (ulong)in_stack_ffffffffffffffbc * 4)) {
    }
    *(uint *)(in_RCX + (ulong)in_stack_ffffffffffffffbc * 4) = in_stack_ffffffffffffffb8;
    for (; in_R9[in_stack_ffffffffffffffb8] =
                (uint64_t *)((long)in_R9[in_stack_ffffffffffffffb8] + 1),
        *(uint *)(in_RCX + (ulong)in_stack_ffffffffffffffb8 * 4) != in_stack_ffffffffffffffb8;
        in_stack_ffffffffffffffb8 = *(uint *)(in_RCX + (ulong)in_stack_ffffffffffffffb8 * 4)) {
    }
  }
  hufCanonicalCodeTable(in_stack_00000140);
  memcpy(in_RDI,in_R9,0x80008);
  return;
}

Assistant:

static void
hufBuildEncTable (
    uint64_t*  frq,
    uint32_t*  im,
    uint32_t*  iM,
    uint32_t*  hlink,
    uint64_t** fHeap,
    uint64_t*  scode)
{
    //
    // This function assumes that when it is called, array frq
    // indicates the frequency of all possible symbols in the data
    // that are to be Huffman-encoded.  (frq[i] contains the number
    // of occurrences of symbol i in the data.)
    //
    // The loop below does three things:
    //
    // 1) Finds the minimum and maximum indices that point
    //    to non-zero entries in frq:
    //
    //     frq[im] != 0, and frq[i] == 0 for all i < im
    //     frq[iM] != 0, and frq[i] == 0 for all i > iM
    //
    // 2) Fills array fHeap with pointers to all non-zero
    //    entries in frq.
    //
    // 3) Initializes array hlink such that hlink[i] == i
    //    for all array entries.
    //
    uint32_t nf = 0;

    *im = 0;

    while (!frq[*im])
        (*im)++;

    for (uint32_t i = *im; i < HUF_ENCSIZE; i++)
    {
        hlink[i] = i;

        if (frq[i])
        {
            fHeap[nf] = &frq[i];
            ++nf;
            *iM = i;
        }
    }

    //
    // Add a pseudo-symbol, with a frequency count of 1, to frq;
    // adjust the fHeap and hlink array accordingly.  Function
    // hufEncode() uses the pseudo-symbol for run-length encoding.
    //

    (*iM)++;
    frq[*iM]  = 1;
    fHeap[nf] = &frq[*iM];
    ++nf;

    //
    // Build an array, scode, such that scode[i] contains the number
    // of bits assigned to symbol i.  Conceptually this is done by
    // constructing a tree whose leaves are the symbols with non-zero
    // frequency:
    //
    //     Make a heap that contains all symbols with a non-zero frequency,
    //     with the least frequent symbol on top.
    //
    //     Repeat until only one symbol is left on the heap:
    //
    //         Take the two least frequent symbols off the top of the heap.
    //         Create a new node that has first two nodes as children, and
    //         whose frequency is the sum of the frequencies of the first
    //         two nodes.  Put the new node back into the heap.
    //
    // The last node left on the heap is the root of the tree.  For each
    // leaf node, the distance between the root and the leaf is the length
    // of the code for the corresponding symbol.
    //
    // The loop below doesn't actually build the tree; instead we compute
    // the distances of the leaves from the root on the fly.  When a new
    // node is added to the heap, then that node's descendants are linked
    // into a single linear list that starts at the new node, and the code
    // lengths of the descendants (that is, their distance from the root
    // of the tree) are incremented by one.
    //

    make_heap (fHeap, nf);

    memset (scode, 0, sizeof (uint64_t) * HUF_ENCSIZE);

    while (nf > 1)
    {
        uint32_t mm, m;
        //
        // Find the indices, mm and m, of the two smallest non-zero frq
        // values in fHeap, add the smallest frq to the second-smallest
        // frq, and remove the smallest frq value from fHeap.
        //

        mm = (uint32_t) (fHeap[0] - frq);
        pop_heap (&fHeap[0], &fHeap[nf]);
        --nf;

        m = (uint32_t) (fHeap[0] - frq);
        pop_heap (&fHeap[0], &fHeap[nf]);

        frq[m] += frq[mm];
        push_heap (&fHeap[0], &fHeap[nf]);

        //
        // The entries in scode are linked into lists with the
        // entries in hlink serving as "next" pointers and with
        // the end of a list marked by hlink[j] == j.
        //
        // Traverse the lists that start at scode[m] and scode[mm].
        // For each element visited, increment the length of the
        // corresponding code by one bit. (If we visit scode[j]
        // during the traversal, then the code for symbol j becomes
        // one bit longer.)
        //
        // Merge the lists that start at scode[m] and scode[mm]
        // into a single list that starts at scode[m].
        //

        //
        // Add a bit to all codes in the first list.
        //

        for (uint32_t j = m;; j = hlink[j])
        {
            scode[j]++;

            if (hlink[j] == j)
            {
                //
                // Merge the two lists.
                //

                hlink[j] = mm;
                break;
            }
        }

        //
        // Add a bit to all codes in the second list
        //

        for (uint32_t j = mm;; j = hlink[j])
        {
            scode[j]++;

            if (hlink[j] == j) break;
        }
    }

    //
    // Build a canonical Huffman code table, replacing the code
    // lengths in scode with (code, code length) pairs.  Copy the
    // code table from scode into frq.
    //

    hufCanonicalCodeTable (scode);
    memcpy (frq, scode, sizeof (uint64_t) * HUF_ENCSIZE);
}